

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txrequest_tests.cpp
# Opt level: O3

void __thiscall anon_unknown.dwarf_1a982c5::Scenario::DisconnectedPeer(Scenario *this,NodeId peer)

{
  pointer *pppVar1;
  long lVar2;
  Runner *pRVar3;
  pointer ppVar4;
  pointer ppVar5;
  _Manager_type p_Var6;
  undefined8 uVar7;
  size_type __n;
  long lVar8;
  pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_> *ppVar9;
  pointer ppVar10;
  pointer ppVar11;
  pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_> *__cur;
  pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_> *ppVar12;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pRVar3 = this->m_runner;
  ppVar11 = (pRVar3->actions).
            super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar11 ==
      (pRVar3->actions).
      super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    __n = _GLOBAL__N_1::std::
          vector<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
          ::_M_check_len(&pRVar3->actions,1,"vector::_M_realloc_insert");
    ppVar4 = (pRVar3->actions).
             super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar5 = (pRVar3->actions).
             super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    lVar8 = (long)ppVar11 - (long)ppVar4 >> 3;
    if (__n == 0) {
      ppVar9 = (pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>
                *)0x0;
    }
    else {
      ppVar9 = __gnu_cxx::
               new_allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>
               ::allocate((new_allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>
                           *)&pRVar3->actions,__n,(void *)0x0);
    }
    (&ppVar9->first)[lVar8].__r = (this->m_now).__r;
    *(Runner **)((long)&(ppVar9->second).super__Function_base._M_functor + lVar8 * 8) = pRVar3;
    *(NodeId *)((long)&(ppVar9->second).super__Function_base._M_functor + lVar8 * 8 + 8) = peer;
    (&(ppVar9->second)._M_invoker)[lVar8] =
         _GLOBAL__N_1::std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:126:44)>
         ::_M_invoke;
    (&(ppVar9->second).super__Function_base._M_manager)[lVar8] =
         _GLOBAL__N_1::std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:126:44)>
         ::_M_manager;
    ppVar12 = ppVar9;
    for (ppVar10 = ppVar4; ppVar10 != ppVar11; ppVar10 = ppVar10 + 1) {
      (ppVar12->first).__r = (ppVar10->first).__r;
      *(undefined8 *)&(ppVar12->second).super__Function_base._M_functor = 0;
      *(undefined8 *)((long)&(ppVar12->second).super__Function_base._M_functor + 8) = 0;
      (ppVar12->second).super__Function_base._M_manager = (_Manager_type)0x0;
      (ppVar12->second)._M_invoker = (ppVar10->second)._M_invoker;
      p_Var6 = (ppVar10->second).super__Function_base._M_manager;
      if (p_Var6 != (_Manager_type)0x0) {
        uVar7 = *(undefined8 *)((long)&(ppVar10->second).super__Function_base._M_functor + 8);
        *(undefined8 *)&(ppVar12->second).super__Function_base._M_functor =
             *(undefined8 *)&(ppVar10->second).super__Function_base._M_functor;
        *(undefined8 *)((long)&(ppVar12->second).super__Function_base._M_functor + 8) = uVar7;
        (ppVar12->second).super__Function_base._M_manager = p_Var6;
        (ppVar10->second).super__Function_base._M_manager = (_Manager_type)0x0;
        (ppVar10->second)._M_invoker = (_Invoker_type)0x0;
      }
      ppVar12 = ppVar12 + 1;
    }
    for (; ppVar12 = ppVar12 + 1, ppVar5 != ppVar11; ppVar11 = ppVar11 + 1) {
      (ppVar12->first).__r = (ppVar11->first).__r;
      *(undefined8 *)&(ppVar12->second).super__Function_base._M_functor = 0;
      *(undefined8 *)((long)&(ppVar12->second).super__Function_base._M_functor + 8) = 0;
      (ppVar12->second).super__Function_base._M_manager = (_Manager_type)0x0;
      (ppVar12->second)._M_invoker = (ppVar11->second)._M_invoker;
      p_Var6 = (ppVar11->second).super__Function_base._M_manager;
      if (p_Var6 != (_Manager_type)0x0) {
        uVar7 = *(undefined8 *)((long)&(ppVar11->second).super__Function_base._M_functor + 8);
        *(undefined8 *)&(ppVar12->second).super__Function_base._M_functor =
             *(undefined8 *)&(ppVar11->second).super__Function_base._M_functor;
        *(undefined8 *)((long)&(ppVar12->second).super__Function_base._M_functor + 8) = uVar7;
        (ppVar12->second).super__Function_base._M_manager = p_Var6;
        (ppVar11->second).super__Function_base._M_manager = (_Manager_type)0x0;
        (ppVar11->second)._M_invoker = (_Invoker_type)0x0;
      }
    }
    if (ppVar4 != (pointer)0x0) {
      operator_delete(ppVar4,(long)(pRVar3->actions).
                                   super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppVar4
                     );
    }
    (pRVar3->actions).
    super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = ppVar9;
    (pRVar3->actions).
    super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar12;
    (pRVar3->actions).
    super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = ppVar9 + __n;
  }
  else {
    (ppVar11->first).__r = (this->m_now).__r;
    *(Runner **)&(ppVar11->second).super__Function_base._M_functor = pRVar3;
    *(NodeId *)((long)&(ppVar11->second).super__Function_base._M_functor + 8) = peer;
    (ppVar11->second)._M_invoker =
         _GLOBAL__N_1::std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:126:44)>
         ::_M_invoke;
    (ppVar11->second).super__Function_base._M_manager =
         _GLOBAL__N_1::std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp:126:44)>
         ::_M_manager;
    pppVar1 = &(pRVar3->actions).
               super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *pppVar1 = *pppVar1 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void DisconnectedPeer(NodeId peer)
    {
        auto& runner = m_runner;
        runner.actions.emplace_back(m_now, [=,&runner]() {
            runner.txrequest.DisconnectedPeer(peer);
            runner.txrequest.SanityCheck();
        });
    }